

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.cpp
# Opt level: O2

void __thiscall PECommander::initCommands(PECommander *this)

{
  SectionByAddrCommand *pSVar1;
  Command *pCVar2;
  SectionDumpCommand *pSVar3;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"secV",&local_59);
  pSVar1 = (SectionByAddrCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Section by RVA",&local_5a)
  ;
  SectionByAddrCommand::SectionByAddrCommand(pSVar1,RVA,&local_58);
  Commander::addCommand((Commander *)this,&local_38,(Command *)pSVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"secR",&local_59);
  pSVar1 = (SectionByAddrCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Section by RAW",&local_5a)
  ;
  SectionByAddrCommand::SectionByAddrCommand(pSVar1,RAW,&local_58);
  Commander::addCommand((Commander *)this,&local_38,(Command *)pSVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"rstrings",&local_59);
  pCVar2 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Print Strings from resources",&local_5a);
  PrintStringsCommand::PrintStringsCommand((PrintStringsCommand *)pCVar2,&local_58);
  Commander::addCommand((Commander *)this,&local_38,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"rsl",&local_59);
  pCVar2 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"List Resource Types",&local_5a);
  PrintWrapperTypesCommand::PrintWrapperTypesCommand((PrintWrapperTypesCommand *)pCVar2,&local_58);
  Commander::addCommand((Commander *)this,&local_38,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"rs",&local_59);
  pCVar2 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Resource Info",&local_5a);
  WrapperInfoCommand::WrapperInfoCommand((WrapperInfoCommand *)pCVar2,&local_58);
  Commander::addCommand((Commander *)this,&local_38,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dir_mv",&local_59);
  pCVar2 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Move DataDirectory",&local_5a);
  MoveDataDirEntryCommand::MoveDataDirEntryCommand((MoveDataDirEntryCommand *)pCVar2,&local_58);
  Commander::addCommand((Commander *)this,&local_38,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"secinfo",&local_59);
  pSVar3 = (SectionDumpCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Dump chosen Section info",&local_5a);
  SectionDumpCommand::SectionDumpCommand(pSVar3,&local_58,false);
  Commander::addCommand((Commander *)this,&local_38,(Command *)pSVar3,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"secfdump",&local_59);
  pSVar3 = (SectionDumpCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Dump chosen Section Content into a file",&local_5a);
  SectionDumpCommand::SectionDumpCommand(pSVar3,&local_58,true);
  Commander::addCommand((Commander *)this,&local_38,(Command *)pSVar3,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"explist",&local_59);
  pCVar2 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"List all exports",&local_5a);
  ExportsListCommand::ExportsListCommand((ExportsListCommand *)pCVar2,&local_58);
  Commander::addCommand((Commander *)this,&local_38,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"implist",&local_59);
  pCVar2 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"List all imports",&local_5a);
  ImportsListCommand::ImportsListCommand((ImportsListCommand *)pCVar2,&local_58);
  Commander::addCommand((Commander *)this,&local_38,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PECommander::initCommands()
{
    this->addCommand("secV", new SectionByAddrCommand(Executable::RVA, "Section by RVA"));
    this->addCommand("secR", new SectionByAddrCommand(Executable::RAW, "Section by RAW"));

    this->addCommand("rstrings", new PrintStringsCommand("Print Strings from resources"));
    this->addCommand("rsl", new PrintWrapperTypesCommand("List Resource Types"));
    this->addCommand("rs", new WrapperInfoCommand("Resource Info"));

    this->addCommand("dir_mv", new MoveDataDirEntryCommand("Move DataDirectory"));
    this->addCommand("secinfo", new SectionDumpCommand("Dump chosen Section info"));
    this->addCommand("secfdump", new SectionDumpCommand("Dump chosen Section Content into a file", true));
    
    this->addCommand("explist", new ExportsListCommand("List all exports"));
    this->addCommand("implist", new ImportsListCommand("List all imports"));
}